

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionRewind.h
# Opt level: O0

void __thiscall Hpipe::InstructionRewind::~InstructionRewind(InstructionRewind *this)

{
  InstructionRewind *this_local;
  
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__InstructionRewind_002907a0;
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&this->ncx);
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Vec
            (&this->strs_to_cancel);
  Vec<Hpipe::InstructionRewind::CodeSeqItem>::~Vec(&this->code_seq_end);
  Vec<Hpipe::InstructionRewind::CodeSeqItem>::~Vec(&this->code_seq_beg);
  Instruction::~Instruction(&this->super_Instruction);
  return;
}

Assistant:

CodeSeqItem( unsigned offset, InstructionWithCode *code ) : offset( offset ), code( code ) {}